

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3TwoPartName(Parse *pParse,Token *pName1,Token *pName2,Token **pUnqual)

{
  Token *in_RCX;
  sqlite3 *in_RDX;
  char *in_RSI;
  Parse *in_RDI;
  sqlite3 *db;
  int iDb;
  uint local_2c;
  
  if (*(int *)&in_RDX->pVdbe == 0) {
    local_2c = (uint)(in_RDI->db->init).iDb;
    in_RCX->z = in_RSI;
  }
  else {
    if ((in_RDI->db->init).busy != '\0') {
      sqlite3ErrorMsg(in_RDI,"corrupt database");
      return -1;
    }
    in_RCX->z = (char *)in_RDX;
    local_2c = sqlite3FindDb(in_RDX,in_RCX);
    if ((int)local_2c < 0) {
      sqlite3ErrorMsg(in_RDI,"unknown database %T",in_RSI);
      return -1;
    }
  }
  return local_2c;
}

Assistant:

SQLITE_PRIVATE int sqlite3TwoPartName(
  Parse *pParse,      /* Parsing and code generating context */
  Token *pName1,      /* The "xxx" in the name "xxx.yyy" or "xxx" */
  Token *pName2,      /* The "yyy" in the name "xxx.yyy" */
  Token **pUnqual     /* Write the unqualified object name here */
){
  int iDb;                    /* Database holding the object */
  sqlite3 *db = pParse->db;

  assert( pName2!=0 );
  if( pName2->n>0 ){
    if( db->init.busy ) {
      sqlite3ErrorMsg(pParse, "corrupt database");
      return -1;
    }
    *pUnqual = pName2;
    iDb = sqlite3FindDb(db, pName1);
    if( iDb<0 ){
      sqlite3ErrorMsg(pParse, "unknown database %T", pName1);
      return -1;
    }
  }else{
    assert( db->init.iDb==0 || db->init.busy || IN_SPECIAL_PARSE
             || (db->mDbFlags & DBFLAG_Vacuum)!=0);
    iDb = db->init.iDb;
    *pUnqual = pName1;
  }
  return iDb;
}